

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_symbol.cpp
# Opt level: O0

compile_errcode __thiscall
SymbolTableTree::GetTermIntValue
          (SymbolTableTree *this,string *begin_func_name,string *name,int *value)

{
  FILE *__stream;
  bool bVar1;
  __type _Var2;
  compile_errcode cVar3;
  pointer ppVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  string local_98;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>_>_>_>
  local_68;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>_>_>_>
  local_60;
  iterator iter;
  string cur_func_name;
  int ret;
  int *value_local;
  string *name_local;
  string *begin_func_name_local;
  SymbolTableTree *this_local;
  
  std::__cxx11::string::string((string *)&iter,(string *)begin_func_name);
  do {
    local_60._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>
          *)std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>_>_>
            ::begin(&this->m_table_tree);
    while( true ) {
      local_68._M_current =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>
            *)std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>_>_>
              ::end(&this->m_table_tree);
      bVar1 = __gnu_cxx::operator!=(&local_60,&local_68);
      if (!bVar1) break;
      ppVar4 = __gnu_cxx::
               __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>_>_>_>
               ::operator->(&local_60);
      _Var2 = std::operator==(&ppVar4->first,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &iter);
      if (_Var2) break;
      __gnu_cxx::
      __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>_>_>_>
      ::operator++(&local_60);
    }
    ppVar4 = __gnu_cxx::
             __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>_>_>_>
             ::operator->(&local_60);
    cVar3 = SymbolTable::GetTermIntValue(&ppVar4->second,name,value);
    if (cVar3 == 0) {
      this_local._4_4_ = 0;
      goto LAB_001832bf;
    }
    ppVar4 = __gnu_cxx::
             __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>_>_>_>
             ::operator->(&local_60);
    SymbolTable::GetPreviousTableName_abi_cxx11_(&local_98,&ppVar4->second);
    std::__cxx11::string::operator=((string *)&iter,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &iter,&this->m_BOTTOM_LEVEL);
    __stream = _stderr;
    if (!bVar1) {
      uVar5 = std::__cxx11::string::c_str();
      uVar6 = std::__cxx11::string::c_str();
      fprintf(__stream,"(int value)no match term name: %s---%s\n",uVar5,uVar6);
      this_local._4_4_ = -3;
LAB_001832bf:
      std::__cxx11::string::~string((string *)&iter);
      return this_local._4_4_;
    }
  } while( true );
}

Assistant:

compile_errcode SymbolTableTree::GetTermIntValue(const string& begin_func_name, const string& name, int& value) {
    int ret = COMPILE_OK;
    string cur_func_name = begin_func_name;
    do {
        auto iter = m_table_tree.begin(); 
        for (; iter != m_table_tree.end(); ++iter) {
            if (iter->first == cur_func_name) {
                break;
            }
        }
        if ((ret = iter->second.GetTermIntValue(name, value)) != COMPILE_OK) {
            cur_func_name = iter->second.GetPreviousTableName();
        } else {
            return COMPILE_OK;
        }
    } while(cur_func_name != m_BOTTOM_LEVEL);
    fprintf(stderr, "(int value)no match term name: %s---%s\n", begin_func_name.c_str(), name.c_str());
    return NOT_FIND_TERM;
}